

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::ComputeAbsoluteTransform(PretransformVertices *this,aiNode *pcNode)

{
  uint local_5c;
  uint i;
  aiNode *local_18;
  aiNode *pcNode_local;
  PretransformVertices *this_local;
  
  local_18 = pcNode;
  pcNode_local = (aiNode *)this;
  if (pcNode->mParent != (aiNode *)0x0) {
    aiMatrix4x4t<float>::operator*
              ((aiMatrix4x4t<float> *)&stack0xffffffffffffffa8,&pcNode->mParent->mTransformation,
               &pcNode->mTransformation);
    memcpy(&local_18->mTransformation,&stack0xffffffffffffffa8,0x40);
  }
  for (local_5c = 0; local_5c < local_18->mNumChildren; local_5c = local_5c + 1) {
    ComputeAbsoluteTransform(this,local_18->mChildren[local_5c]);
  }
  return;
}

Assistant:

void PretransformVertices::ComputeAbsoluteTransform(aiNode *pcNode) {
	if (pcNode->mParent) {
		pcNode->mTransformation = pcNode->mParent->mTransformation * pcNode->mTransformation;
	}

	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		ComputeAbsoluteTransform(pcNode->mChildren[i]);
	}
}